

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::CPY_IM(CPU *this)

{
  int iVar1;
  byte bVar2;
  
  this->cycles = 2;
  iVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 1;
  bVar2 = this->Y - (byte)iVar1;
  (this->field_6).ps =
       bVar2 & 0x80 | (bVar2 == 0) * '\x02' | (byte)iVar1 <= this->Y | (this->field_6).ps & 0x7c;
  return;
}

Assistant:

void CPU::CPY_IM()
{
    cycles = 2;
    uint8_t op = GetByte();
    uint8_t res = Y - op;
    C = (Y >= op);
    Z = (Y == op);
    N = (res & 0b10000000) > 0;
}